

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

char mbedtls_ct_base64_dec_value(uchar c)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  bVar1 = mbedtls_ct_uchar_in_range_if('A','Z',c,c + 0xc0);
  bVar2 = mbedtls_ct_uchar_in_range_if('a','z',c,c + 0xba);
  bVar3 = mbedtls_ct_uchar_in_range_if('0','9',c,c + '\x05');
  bVar4 = mbedtls_ct_uchar_in_range_if('+','+',c,c + '\x14');
  bVar5 = mbedtls_ct_uchar_in_range_if('/','/',c,c + '\x11');
  return (bVar5 | bVar4 | bVar3 | bVar2 | bVar1) - 1;
}

Assistant:

MBEDTLS_STATIC_TESTABLE
signed char mbedtls_ct_base64_dec_value(unsigned char c)
{
    unsigned char val = 0;
    /* For each range of digits, if c is in that range, mask val with
     * the corresponding value. Since c can only be in a single range,
     * only at most one masking will change val. Set val to one plus
     * the desired value so that it stays 0 if c is in none of the ranges. */
    val |= mbedtls_ct_uchar_in_range_if('A', 'Z', c, c - 'A' +  0 + 1);
    val |= mbedtls_ct_uchar_in_range_if('a', 'z', c, c - 'a' + 26 + 1);
    val |= mbedtls_ct_uchar_in_range_if('0', '9', c, c - '0' + 52 + 1);
    val |= mbedtls_ct_uchar_in_range_if('+', '+', c, c - '+' + 62 + 1);
    val |= mbedtls_ct_uchar_in_range_if('/', '/', c, c - '/' + 63 + 1);
    /* At this point, val is 0 if c is an invalid digit and v+1 if c is
     * a digit with the value v. */
    return val - 1;
}